

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void do_check_xdn(uint tok_idx,uint line,char *file)

{
  uint uVar1;
  char *fmt;
  char *in_R8;
  
  do_check(tokens[tok_idx].tp == SH4ASM_TOK_XDN,"(tokens[tok_idx].tp == SH4ASM_TOK_XDN)",
           "do_check_xdn",0x60,in_R8);
  uVar1 = tokens[tok_idx].val.as_int;
  if (uVar1 < 0x10) {
    if ((uVar1 & 1) == 0) {
      return;
    }
    fmt = 
    "invalid non-even banked double-precision floating-point register index %u (see line %d of %s)";
  }
  else {
    fmt = 
    "invalid out-of-range banked double-precision floating-point register index %u (see line %d of %s)"
    ;
  }
  sh4asm_error(fmt,(ulong)uVar1,line,
               "/workspace/llm4binary/github/license_c_cmakelists/washingtondc-emu[P]sh4asm/sh4asm_core/parser.c"
              );
}

Assistant:

static void do_check_xdn(unsigned tok_idx, unsigned line, char const *file) {
    CHECK(tokens[tok_idx].tp == SH4ASM_TOK_XDN);
    unsigned reg_idx = tokens[tok_idx].val.reg_idx;
    if (reg_idx >= 16)
        sh4asm_error("invalid out-of-range banked double-precision floating-point "
             "register index %u (see line %d of %s)", reg_idx, line, file);
    if (reg_idx & 1)
        sh4asm_error("invalid non-even banked double-precision floating-point "
             "register index %u (see line %d of %s)", reg_idx, line, file);
}